

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> * __thiscall
dg::llvmdg::legacy::GraphBuilder::getCalledFunctions
          (vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
           *__return_storage_ptr__,GraphBuilder *this,Value *v)

{
  pointer ppFVar1;
  
  if ((v == (Value *)0x0) || (v[0x10] != (Value)0x0)) {
    if (this->pointsToAnalysis_ == (LLVMPointerAnalysis *)0x0) {
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      dg::getCalledFunctions(__return_storage_ptr__,v,this->pointsToAnalysis_);
    }
  }
  else {
    ppFVar1 = (pointer)operator_new(8);
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
    super__Vector_impl_data._M_start = ppFVar1;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppFVar1 + 1;
    *ppFVar1 = (Function *)v;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppFVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const llvm::Function *>
GraphBuilder::getCalledFunctions(const llvm::Value *v) {
    if (const auto *F = llvm::dyn_cast<llvm::Function>(v)) {
        return {F};
    }

    if (!pointsToAnalysis_)
        return {};

    return dg::getCalledFunctions(v, pointsToAnalysis_);
}